

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int StringTest(lua_State *L)

{
  LuaArgType LVar1;
  char *pString;
  
  LVar1 = CLua::GetArgumentType(pLua,1);
  if (LVar1 != ARG_TYPE_STRING) {
    puts("Fail: StringTest argument is not a String");
    sLuaBasedTestResult = sLuaBasedTestResult + -4;
  }
  pString = CLua::GetStringArgument(pLua,1,"fail");
  CLua::PushString(pLua,pString);
  return 1;
}

Assistant:

LuaGlue(StringTest)
{
    if (pLua->GetArgumentType(1) != LuaArgType::ARG_TYPE_STRING)
    {
        printf("Fail: StringTest argument is not a String\n");
        sLuaBasedTestResult += -4;
    }
    const char* r = pLua->GetStringArgument(1, "fail");
    pLua->PushString(r);
    return 1;
}